

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O2

void __thiscall csm::Version::Version(Version *this,string *version)

{
  vector<int,_std::allocator<int>_> *this_00;
  long lVar1;
  Error *pEVar2;
  allocator<char> local_9d;
  ErrorType local_9c;
  vector<int,_std::allocator<int>_> *local_98;
  string v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98 = &this->theVersions;
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)version,0x2e);
    if (lVar1 == -1) {
      std::__cxx11::string::substr((ulong)&v,(ulong)version);
      lVar1 = std::__cxx11::string::find_first_not_of((char *)&v,0x12195c);
      this_00 = local_98;
      if (lVar1 == -1) {
        local_70._M_dataplus._M_p._0_4_ = atoi(v._M_dataplus._M_p);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_70);
        std::__cxx11::string::~string((string *)&v);
        return;
      }
      pEVar2 = (Error *)__cxa_allocate_exception(0x50);
      local_9c = INVALID_USE;
      std::operator+(&local_70,"Invalid version component: ",&v);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"csm::Version::Version",&local_9d);
      Error::Error(pEVar2,&local_9c,&local_70,&local_50);
      __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
    }
    std::__cxx11::string::substr((ulong)&v,(ulong)version);
    lVar1 = std::__cxx11::string::find_first_not_of((char *)&v,0x12195c);
    if (lVar1 != -1) break;
    local_70._M_dataplus._M_p._0_4_ = atoi(v._M_dataplus._M_p);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_98,(int *)&local_70);
    std::__cxx11::string::~string((string *)&v);
  }
  pEVar2 = (Error *)__cxa_allocate_exception(0x50);
  local_9c = INVALID_USE;
  std::operator+(&local_70,"Invalid version component: ",&v);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"csm::Version::Version",&local_9d);
  Error::Error(pEVar2,&local_9c,&local_70,&local_50);
  __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

Version::Version(const std::string& version)
   :
      theVersions()
{
   static const char* const MODULE = "csm::Version::Version";

   // split on periods
   std::string::size_type pos = 0;
   std::string::size_type dotPos = 0;
   while ( (dotPos = version.find('.', pos)) != std::string::npos )
   {
      const std::string v = version.substr(pos, dotPos - pos);
      if (v.find_first_not_of("1234567890") != std::string::npos)
      {
         throw Error(Error::INVALID_USE, "Invalid version component: " + v,
                     MODULE);
      }

      theVersions.push_back(std::atoi(v.c_str()));
      pos = dotPos + 1;
   }

   // add the final version
   const std::string v = version.substr(pos);
   if (v.find_first_not_of("1234567890") != std::string::npos)
   {
      throw Error(Error::INVALID_USE, "Invalid version component: " + v,
                  MODULE);
   }
   theVersions.push_back(std::atoi(v.c_str()));
}